

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

void __thiscall Assimp::Ogre::VertexData::~VertexData(VertexData *this)

{
  Reset(this);
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>_>
  ::~_Rb_tree(&(this->vertexBindings)._M_t);
  std::_Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>::
  ~_Vector_base(&(this->vertexElements).
                 super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>
               );
  IVertexData::~IVertexData(&this->super_IVertexData);
  return;
}

Assistant:

VertexData::~VertexData()
{
    Reset();
}